

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::point3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *result)

{
  bool bVar1;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  point3f value_1;
  char nc;
  char c;
  undefined1 local_34 [8];
  point3f value;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._4_8_ = result;
  ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,(point3f *)local_34);
    if (bVar1) {
      ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::push_back
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 value._4_8_,(value_type *)local_34);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)&value_1.y + 2));
        if (!bVar1) {
          return false;
        }
        if (value_1.y._2_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)&value_1.y + 1));
          if (!bVar1) {
            return false;
          }
          if (value_1.y._1_1_ == end_symbol) break;
        }
        if (value_1.y._2_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,(point3f *)local_68);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        push_back((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                  value._4_8_,(value_type *)local_68);
      }
      bVar1 = ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
              empty((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                    value._4_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_88,"Empty array.\n",&local_89);
        PushError(this,&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&value_1.z,"Not starting with the value of requested type.\n",
                 (allocator *)((long)&value_1.y + 3));
      PushError(this,(string *)&value_1.z);
      ::std::__cxx11::string::~string((string *)&value_1.z);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&value_1.y + 3));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}